

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  OneofDescriptor *oneof_descriptor;
  undefined4 extraout_var;
  Message *pMVar6;
  Arena *pAVar7;
  undefined4 extraout_var_00;
  Message *default_message_1;
  Message *default_message;
  Message **result_holder;
  Message *result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  anon_unknown_0::CheckInvalidAccess(&this->schema_,field);
  result = (Message *)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message *)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (Reflection *)
                 internal::ExtensionSet::MutableMessage(this_00,field,(MessageFactory *)result);
  }
  else {
    default_message = (Message *)MutableRaw<google::protobuf::Message*>(this,message,field);
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar1) {
      bVar1 = HasOneofField(this,message,field);
      if (!bVar1) {
        oneof_descriptor = FieldDescriptor::containing_oneof(field);
        ClearOneof(this,message,oneof_descriptor);
        default_message = (Message *)MutableField<google::protobuf::Message*>(this,message,field);
        pMVar6 = GetDefaultMessageInstance(this,field);
        pAVar7 = MessageLite::GetArenaForAllocation(&message->super_MessageLite);
        iVar4 = (*(pMVar6->super_MessageLite)._vptr_MessageLite[3])(pMVar6,pAVar7);
        (default_message->super_MessageLite)._vptr_MessageLite =
             (_func_int **)CONCAT44(extraout_var,iVar4);
      }
    }
    else {
      SetBit(this,message,field);
    }
    if ((default_message->super_MessageLite)._vptr_MessageLite == (_func_int **)0x0) {
      pMVar6 = GetDefaultMessageInstance(this,field);
      pAVar7 = MessageLite::GetArenaForAllocation(&message->super_MessageLite);
      iVar4 = (*(pMVar6->super_MessageLite)._vptr_MessageLite[3])(pMVar6,pAVar7);
      (default_message->super_MessageLite)._vptr_MessageLite =
           (_func_int **)CONCAT44(extraout_var_00,iVar4);
    }
    this_local = (Reflection *)(default_message->super_MessageLite)._vptr_MessageLite;
  }
  return (Message *)this_local;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = GetDefaultMessageInstance(field);
        *result_holder = default_message->New(message->GetArenaForAllocation());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = GetDefaultMessageInstance(field);
      *result_holder = default_message->New(message->GetArenaForAllocation());
    }
    result = *result_holder;
    return result;
  }
}